

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O2

jpegls_errc
JpegLsEncode(void *destination,size_t destination_length,size_t *bytes_written,void *source,
            size_t source_length,JlsParameters *params,char *error_message)

{
  interleave_mode mode;
  byte_span destination_00;
  byte_span source_00;
  charls_frame_info local_b8;
  charls_jpegls_encoder local_a8;
  
  if ((params->jfif).version == 0) {
    local_a8.near_lossless_ = 0;
    local_a8.interleave_mode_ = None;
    local_a8.color_transformation_ = None;
    local_a8.frame_info_.width = 0;
    local_a8.frame_info_.height = 0;
    local_a8.frame_info_.bits_per_sample = 0;
    local_a8.frame_info_.component_count = 0;
    local_a8.encoding_options_ = include_pc_parameters_jai;
    local_a8.state_ = initial;
    local_a8.writer_.byte_offset_ = 0;
    local_a8.writer_.destination_.data = (uint8_t *)0x0;
    local_a8.writer_.destination_.size = 0;
    local_a8.writer_.component_id_ = '\x01';
    local_a8.user_preset_coding_parameters_.maximum_sample_value = 0;
    local_a8.user_preset_coding_parameters_.threshold1 = 0;
    local_a8.user_preset_coding_parameters_.threshold2 = 0;
    local_a8.user_preset_coding_parameters_.threshold3 = 0;
    local_a8.user_preset_coding_parameters_.reset_value = 0;
    local_a8.preset_coding_parameters_.maximum_sample_value = 0;
    local_a8.preset_coding_parameters_.threshold1 = 0;
    local_a8.preset_coding_parameters_.threshold2 = 0;
    local_a8.preset_coding_parameters_.threshold3 = 0;
    local_a8.preset_coding_parameters_.reset_value = 0;
    destination_00.size = destination_length;
    destination_00.data = (uint8_t *)destination;
    charls_jpegls_encoder::destination(&local_a8,destination_00);
    charls_jpegls_encoder::near_lossless(&local_a8,params->allowedLossyError);
    local_b8.width = params->width;
    local_b8.height = params->height;
    local_b8.bits_per_sample = params->bitsPerSample;
    local_b8.component_count = params->components;
    charls_jpegls_encoder::frame_info(&local_a8,&local_b8);
    mode = params->interleaveMode;
    charls::check_interleave_mode(mode,invalid_argument_interleave_mode);
    local_a8.interleave_mode_ = mode;
    charls_jpegls_encoder::color_transformation(&local_a8,params->colorTransformation);
    local_a8.user_preset_coding_parameters_.maximum_sample_value =
         (params->custom).MaximumSampleValue;
    local_a8.user_preset_coding_parameters_.threshold1 = (params->custom).Threshold1;
    local_a8.user_preset_coding_parameters_.threshold2 = (params->custom).Threshold2;
    local_a8.user_preset_coding_parameters_.threshold3 = (params->custom).Threshold3;
    local_a8.user_preset_coding_parameters_.reset_value = (params->custom).ResetValue;
    source_00.size = source_length;
    source_00.data = (uint8_t *)source;
    charls_jpegls_encoder::encode(&local_a8,source_00,(long)params->stride);
    *bytes_written = local_a8.writer_.byte_offset_;
    if (error_message != (char *)0x0) {
      *error_message = '\0';
    }
    return OK;
  }
  charls::impl::throw_jpegls_error(InvalidJlsParameters);
}

Assistant:

USE_DECL_ANNOTATIONS jpegls_errc CHARLS_API_CALLING_CONVENTION
JpegLsEncode(void* destination, const size_t destination_length, size_t* bytes_written, const void* source,
             const size_t source_length, const JlsParameters* params, char* error_message) noexcept
try
{
    check_argument(check_pointer(params)->jfif.version == 0);

    charls_jpegls_encoder encoder;
    encoder.destination({check_pointer(destination), destination_length});
    encoder.near_lossless(params->allowedLossyError);

    encoder.frame_info({static_cast<uint32_t>(params->width), static_cast<uint32_t>(params->height), params->bitsPerSample,
                        params->components});
    encoder.interleave_mode(params->interleaveMode);
    encoder.color_transformation(params->colorTransformation);
    const auto& pc{params->custom};
    encoder.preset_coding_parameters({pc.MaximumSampleValue, pc.Threshold1, pc.Threshold2, pc.Threshold3, pc.ResetValue});

    encoder.encode({check_pointer(source), source_length}, static_cast<size_t>(params->stride));
    *check_pointer(bytes_written) = encoder.bytes_written();

    clear_error_message(error_message);
    return jpegls_errc::success;
}
catch (...)
{
    return set_error_message(to_jpegls_errc(), error_message);
}